

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

void Abc_NtkDetectClassesTest(Abc_Ntk_t *pNtk,int fSeq,int fVerbose,int fVeryVerbose)

{
  uint uVar1;
  uint uVar2;
  abctime aVar3;
  Vec_Wec_t *vClasses;
  abctime aVar4;
  int level;
  
  aVar3 = Abc_Clock();
  if (fSeq != 0) {
    Abc_NtkFrameExtend(pNtk);
  }
  vClasses = Abc_NtkDetectFinClasses(pNtk,fVerbose);
  uVar1 = vClasses->nSize;
  uVar2 = Abc_NtkFinCountPairs(vClasses);
  level = 0x77ffa3;
  printf("Computed %d equivalence classes with %d item pairs.  ",(ulong)uVar1,(ulong)uVar2);
  aVar4 = Abc_Clock();
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(aVar4 - aVar3) / 1000000.0);
  if (fVeryVerbose != 0) {
    Vec_WecPrint(vClasses,1);
  }
  Vec_WecFree(vClasses);
  return;
}

Assistant:

void Abc_NtkDetectClassesTest( Abc_Ntk_t * pNtk, int fSeq, int fVerbose, int fVeryVerbose )
{
    Vec_Wec_t * vResult;
    abctime clk = Abc_Clock();
    if ( fSeq ) 
        Abc_NtkFrameExtend( pNtk );
    vResult = Abc_NtkDetectFinClasses( pNtk, fVerbose );
    printf( "Computed %d equivalence classes with %d item pairs.  ", Vec_WecSize(vResult), Abc_NtkFinCountPairs(vResult) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVeryVerbose )
        Vec_WecPrint( vResult, 1 );
//    if ( fVerbose )
//        Abc_NtkPrintFinResults( vResult );
    Vec_WecFree( vResult );
}